

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ICUTransService.cpp
# Opt level: O1

XMLSize_t __thiscall
xercesc_4_0::ICUTranscoder::transcodeFrom
          (ICUTranscoder *this,XMLByte *srcData,XMLSize_t srcCount,XMLCh *toFill,XMLSize_t maxChars,
          XMLSize_t *bytesEaten,uchar *charSizes)

{
  byte bVar1;
  TranscodingException *this_00;
  ulong uVar2;
  ulong uVar3;
  XMLUInt32 *pXVar4;
  size_t __n;
  UChar *startTarget;
  UErrorCode err;
  XMLByte *startSrc;
  XMLCh tmpBuf [17];
  ulong in_stack_ffffffffffffff78;
  XMLCh *local_70;
  int local_64;
  XMLByte *local_60;
  XMLCh local_58 [24];
  
  local_64 = 0;
  if (this->fFixed == false) {
    pXVar4 = this->fSrcOffsets;
  }
  else {
    pXVar4 = (XMLUInt32 *)0x0;
  }
  local_70 = toFill;
  local_60 = srcData;
  ucnv_toUnicode_70(this->fConverter,&local_70,toFill + maxChars,&local_60,srcData + srcCount,pXVar4
                    ,in_stack_ffffffffffffff78 & 0xffffffff00000000,&local_64);
  if ((local_64 != 0) && (local_64 != 0xf)) {
    if (this->fFixed == true) {
      XMLString::binToText
                ((uint)(ushort)*local_70,local_58,0x10,0x10,
                 (this->super_XMLTranscoder).fMemoryManager);
      this_00 = (TranscodingException *)__cxa_allocate_exception(0x30);
      TranscodingException::TranscodingException
                (this_00,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/Transcoders/ICU/ICUTransService.cpp"
                 ,0x212,Trans_BadSrcCP,local_58,(this->super_XMLTranscoder).fEncodingName,
                 (XMLCh *)0x0,(XMLCh *)0x0,(this->super_XMLTranscoder).fMemoryManager);
    }
    else {
      this_00 = (TranscodingException *)__cxa_allocate_exception(0x30);
      TranscodingException::TranscodingException
                (this_00,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/Transcoders/ICU/ICUTransService.cpp"
                 ,0x216,Trans_BadSrcSeq,(this->super_XMLTranscoder).fMemoryManager);
    }
    __cxa_throw(this_00,&TranscodingException::typeinfo,XMLException::~XMLException);
  }
  *bytesEaten = (long)local_60 - (long)srcData;
  __n = (long)local_70 - (long)toFill >> 1;
  if (this->fFixed == true) {
    bVar1 = ucnv_getMaxCharSize_70(this->fConverter);
    memset(charSizes,(uint)bVar1,__n);
  }
  else if ((long)local_70 - (long)toFill == 2) {
    *charSizes = (uchar)((long)local_60 - (long)srcData);
  }
  else if (local_70 != toFill) {
    if (__n != 1) {
      uVar2 = 0;
      do {
        uVar3 = uVar2 + 1 & 0xffffffff;
        charSizes[uVar2] = (char)this->fSrcOffsets[uVar3] - (char)this->fSrcOffsets[uVar2];
        uVar2 = uVar2 + 1;
      } while (uVar3 < __n - 1);
    }
    charSizes[__n - 1] = (char)(int)*bytesEaten - (char)this->fSrcOffsets[__n - 1];
  }
  return __n;
}

Assistant:

XMLSize_t
ICUTranscoder::transcodeFrom(const  XMLByte* const          srcData
                            , const XMLSize_t               srcCount
                            ,       XMLCh* const            toFill
                            , const XMLSize_t               maxChars
                            ,       XMLSize_t&              bytesEaten
                            ,       unsigned char* const    charSizes)
{
    // Set up pointers to the start and end of the source buffer
    const XMLByte*  startSrc = srcData;
    const XMLByte*  endSrc = srcData + srcCount;

    //
    //  And now do the target buffer. This works differently according to
    //  whether XMLCh and UChar are the same size or not.
    //
    UChar* startTarget;
    if (sizeof(XMLCh) == sizeof(UChar))
        startTarget = (UChar*)toFill;
    else
        startTarget = (UChar*) getMemoryManager()->allocate
        (
            maxChars * sizeof(UChar)
        );//new UChar[maxChars];
    UChar* orgTarget = startTarget;

    //
    //  Transcode the buffer.  Buffer overflow errors are normal, occuring
    //  when the raw input buffer holds more characters than will fit in
    //  the Unicode output buffer.
    //
    UErrorCode  err = U_ZERO_ERROR;
    ucnv_toUnicode
    (
        fConverter
        , &startTarget
        , startTarget + maxChars
        , (const char**)&startSrc
        , (const char*)endSrc
        , (fFixed ? 0 : (int32_t*)fSrcOffsets)
        , false
        , &err
    );

    if ((err != U_ZERO_ERROR) && (err != U_BUFFER_OVERFLOW_ERROR))
    {
        if (orgTarget != (UChar*)toFill)
            getMemoryManager()->deallocate(orgTarget);//delete [] orgTarget;

        if (fFixed)
        {
            XMLCh tmpBuf[17];
            XMLString::binToText((unsigned int)(*startTarget), tmpBuf, 16, 16, getMemoryManager());
            ThrowXMLwithMemMgr2
            (
                TranscodingException
                , XMLExcepts::Trans_BadSrcCP
                , tmpBuf
                , getEncodingName()
                , getMemoryManager()
            );
        }
        else
        {
            ThrowXMLwithMemMgr(TranscodingException, XMLExcepts::Trans_BadSrcSeq, getMemoryManager());
        }
    }

    // Calculate the bytes eaten and store in caller's param
    bytesEaten = startSrc - srcData;

    // And the characters decoded
    const XMLSize_t charsDecoded = startTarget - orgTarget;

    //
    //  Translate the array of char offsets into an array of character
    //  sizes, which is what the transcoder interface semantics requires.
    //  If its fixed, then we can optimize it.
    //
    if (fFixed)
    {
        const unsigned char fillSize = (unsigned char)ucnv_getMaxCharSize(fConverter);
        memset(charSizes, fillSize, charsDecoded);
    }
    else
    {
        //
        //  We have to convert the series of offsets into a series of
        //  sizes. If just one char was decoded, then its the total bytes
        //  eaten. Otherwise, do a loop and subtract out each element from
        //  its previous element.
        //
        if (charsDecoded == 1)
        {
            charSizes[0] = (unsigned char)bytesEaten;
        }
        else if( charsDecoded > 0 )
        {
            //  ICU does not return an extra element to allow us to figure
            //  out the last char size, so we have to compute it from the
            //  total bytes used.
            unsigned int index;
            for (index = 0; index < charsDecoded - 1; index++)
            {
                charSizes[index] = (unsigned char)(fSrcOffsets[index + 1]
                                                    - fSrcOffsets[index]);
            }

            charSizes[charsDecoded - 1] = (unsigned char)(bytesEaten
                                          - fSrcOffsets[charsDecoded - 1]);
        }
    }

    //
    //  If XMLCh and UChar are not the same size, then we need to copy over
    //  the temp buffer to the new one.
    //
    if (sizeof(UChar) != sizeof(XMLCh))
    {
        XMLCh* outPtr = toFill;
        startTarget = orgTarget;
        for (unsigned int index = 0; index < charsDecoded; index++)
            *outPtr++ = XMLCh(*startTarget++);

        // And delete the temp buffer
        getMemoryManager()->deallocate(orgTarget);//delete [] orgTarget;
    }

    // Return the chars we put into the target buffer
    return charsDecoded;
}